

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_nlinks(char *file,wchar_t line,char *pathname,wchar_t nlinks)

{
  int iVar1;
  uint in_ECX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t r;
  stat st;
  stat local_b8;
  uint local_24;
  char *local_20;
  wchar_t local_14;
  char *local_10;
  wchar_t local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  assertion_count(in_RDI,in_ESI);
  iVar1 = lstat(local_20,&local_b8);
  if ((iVar1 == 0) && ((uint)local_b8.st_nlink == local_24)) {
    local_4 = L'\x01';
  }
  else {
    failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File %s has %d links, expected %d",
                  local_20,local_b8.st_nlink,(ulong)local_24);
    failure_finish((void *)0x107f2c);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_file_nlinks(const char *file, int line,
    const char *pathname, int nlinks)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi;
	int r;

	assertion_count(file, line);
	r = my_GetFileInformationByName(pathname, &bhfi);
	if (r != 0 && bhfi.nNumberOfLinks == (DWORD)nlinks)
		return (1);
	failure_start(file, line, "File %s has %d links, expected %d",
	    pathname, bhfi.nNumberOfLinks, nlinks);
	failure_finish(NULL);
	return (0);
#else
	struct stat st;
	int r;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r == 0 && (int)st.st_nlink == nlinks)
			return (1);
	failure_start(file, line, "File %s has %d links, expected %d",
	    pathname, st.st_nlink, nlinks);
	failure_finish(NULL);
	return (0);
#endif
}